

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O2

Unique<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> __thiscall
anurbs::
new_<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>const&,anurbs::Interval_const&>
          (anurbs *this,Ref<anurbs::NurbsCurveGeometry<2L>_> *args,Interval *args_1)

{
  Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *this_00;
  __shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2> _Stack_38
  ;
  
  this_00 = (Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> *)operator_new(0x28);
  std::__shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&_Stack_38,
               (__shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<2L>_>,_(__gnu_cxx::_Lock_policy)2>
                *)args);
  Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>::Curve
            (this_00,(Ref<anurbs::NurbsCurveGeometry<2L>_> *)&_Stack_38,*args_1);
  *(Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_> **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return (__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_std::default_delete<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}